

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall ON_SubDEdge::FaceArrayIndex(ON_SubDEdge *this,ON_SubDFace *f)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = 0xffffffff;
  if (f != (ON_SubDFace *)0x0) {
    uVar1 = this->m_face_count;
    if ((ulong)uVar1 != 0) {
      if ((ON_SubDFace *)(this->m_face2[0].m_ptr & 0xfffffffffffffff8) == f) {
        uVar2 = 0;
      }
      else if (uVar1 != 1) {
        if ((ON_SubDFace *)(this->m_face2[1].m_ptr & 0xfffffffffffffff8) == f) {
          return 1;
        }
        if ((2 < uVar1) && (this->m_facex != (ON_SubDFacePtr *)0x0)) {
          for (uVar3 = 2; uVar1 != uVar3; uVar3 = uVar3 + 1) {
            if ((ON_SubDFace *)(this->m_facex[uVar3 - 2].m_ptr & 0xfffffffffffffff8) == f) {
              return (uint)uVar3;
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

unsigned int ON_SubDEdge::FaceArrayIndex(
  const ON_SubDFace* f
  ) const
{
  if (nullptr == f)
    return ON_UNSET_UINT_INDEX;
  const unsigned int face_count = m_face_count;
  if (face_count > 0)
  {
    if (f == ON_SUBD_FACE_POINTER(m_face2[0].m_ptr))
      return 0;
    if (face_count > 1)
    {
      if (f == ON_SUBD_FACE_POINTER(m_face2[1].m_ptr))
        return 1;
      if (face_count > 2 && nullptr != m_facex)
      {
        const ON_SubDFacePtr* fptr = m_facex - 2;
        for (unsigned int efi = 2; efi < face_count; efi++)
        {
          if (f == ON_SUBD_FACE_POINTER(fptr[efi].m_ptr))
            return efi;
        }
      }
    }
  }
  return ON_UNSET_UINT_INDEX;
}